

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_NtkDfs_rec(Bac_Ntk_t *p,int iObj,Vec_Int_t *vBoxes)

{
  byte bVar1;
  int iObj_00;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  
  if ((iObj < 0) || ((p->vType).nSize <= iObj)) {
LAB_003bae0c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  bVar1 = (p->vType).pArray[(uint)iObj];
  bVar2 = bVar1 & 0xfe;
  if (bVar2 != 2) {
    if (bVar2 == 8) {
      __assert_fail("Bac_ObjIsCo(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
    }
    if ((bVar1 >> 1) - 0x49 < 0xffffffbc) {
      __assert_fail("Bac_ObjIsPi(p, iObj) || Bac_ObjIsBox(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                    ,0x1c2,"void Bac_NtkDfs_rec(Bac_Ntk_t *, int, Vec_Int_t *)");
    }
  }
  if ((p->vCopy).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = (p->vCopy).pArray[(uint)iObj];
  if (0 < iVar3) {
    return;
  }
  if (iVar3 != -1) {
    __assert_fail("Bac_ObjCopy(p, i) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
  }
  Vec_IntSetEntry(&p->vCopy,iObj,1);
  if (iObj != 0) {
    uVar4 = (ulong)(iObj - 1);
    iVar3 = 0;
    do {
      if ((p->vType).nSize <= (int)uVar4) goto LAB_003bae0c;
      if (((p->vType).pArray[uVar4] & 0xfeU) != 6) break;
      iObj_00 = Bac_BoxFanin(p,iObj,iVar3);
      Bac_NtkDfs_rec(p,iObj_00,vBoxes);
      uVar4 = uVar4 - 1;
      iVar3 = iVar3 + 1;
    } while (-1 < (int)uVar4);
  }
  Vec_IntPush(vBoxes,iObj);
  return;
}

Assistant:

void Bac_NtkDfs_rec( Bac_Ntk_t * p, int iObj, Vec_Int_t * vBoxes )
{
    int k, iFanin;
    if ( Bac_ObjIsBo(p, iObj) == 1 )
    {
        Bac_NtkDfs_rec( p, Bac_ObjFanin(p, iObj), vBoxes );
        return;
    }
    assert( Bac_ObjIsPi(p, iObj) || Bac_ObjIsBox(p, iObj) );
    if ( Bac_ObjCopy(p, iObj) > 0 ) // visited
        return;
    Bac_ObjSetCopy( p, iObj, 1 );
    Bac_BoxForEachFanin( p, iObj, iFanin, k )
        Bac_NtkDfs_rec( p, iFanin, vBoxes );
    Vec_IntPush( vBoxes, iObj );
}